

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::BayesianProbitRegressor_FeatureWeight::InternalSwap
          (BayesianProbitRegressor_FeatureWeight *this,BayesianProbitRegressor_FeatureWeight *other)

{
  uint32_t uVar1;
  intptr_t iVar2;
  
  iVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar2;
  google::protobuf::
  RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight>::InternalSwap
            (&this->weights_,&other->weights_);
  uVar1 = this->featureid_;
  this->featureid_ = other->featureid_;
  other->featureid_ = uVar1;
  return;
}

Assistant:

void BayesianProbitRegressor_FeatureWeight::InternalSwap(BayesianProbitRegressor_FeatureWeight* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  weights_.InternalSwap(&other->weights_);
  swap(featureid_, other->featureid_);
}